

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O0

void t1(void)

{
  undefined4 in_EAX;
  undefined4 uVar1;
  int v;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  undefined4 uVar2;
  char *pcVar3;
  
  printf("Mode/PUD/read/write tests.\n");
  set_mode(0x19,0);
  uVar1 = get_mode(0x19);
  pcVar3 = (char *)CONCAT44(uVar1,in_EAX);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar3);
  uVar2 = SUB84(pcVar3,0);
  set_pull_up_down(0x19,2);
  uVar1 = gpio_read(0x19);
  pcVar3 = (char *)CONCAT44(uVar1,uVar2);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar3);
  uVar2 = SUB84(pcVar3,0);
  set_pull_up_down(0x19,1);
  uVar1 = gpio_read(0x19);
  pcVar3 = (char *)CONCAT44(uVar1,uVar2);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar3);
  uVar2 = SUB84(pcVar3,0);
  gpio_write(0x19,0);
  uVar1 = get_mode(0x19);
  pcVar3 = (char *)CONCAT44(uVar1,uVar2);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar3);
  uVar2 = SUB84(pcVar3,0);
  uVar1 = gpio_read(0x19);
  pcVar3 = (char *)CONCAT44(uVar1,uVar2);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,pcVar3);
  uVar2 = SUB84(pcVar3,0);
  gpio_write(0x19,1);
  uVar1 = gpio_read(0x19);
  CHECK(in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,v,
        (char *)CONCAT44(uVar1,uVar2));
  return;
}

Assistant:

void t1()
{
   int v;

   printf("Mode/PUD/read/write tests.\n");

   set_mode(GPIO, PI_INPUT);
   v = get_mode(GPIO);
   CHECK(1, 1, v, 0, 0, "set mode, get mode");

   set_pull_up_down(GPIO, PI_PUD_UP);
   v = gpio_read(GPIO);
   CHECK(1, 2, v, 1, 0, "set pull up down, read");

   set_pull_up_down(GPIO, PI_PUD_DOWN);
   v = gpio_read(GPIO);
   CHECK(1, 3, v, 0, 0, "set pull up down, read");

   gpio_write(GPIO, PI_LOW);
   v = get_mode(GPIO);
   CHECK(1, 4, v, 1, 0, "write, get mode");

   v = gpio_read(GPIO);
   CHECK(1, 5, v, 0, 0, "read");

   gpio_write(GPIO, PI_HIGH);
   v = gpio_read(GPIO);
   CHECK(1, 6, v, 1, 0, "write, read");
}